

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

QMatrix * Transp_Q(QMatrix *Q)

{
  LASErrIdType LVar1;
  QMatrix *Q_00;
  char *pcVar2;
  size_t sVar3;
  char *Object1Name;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ElOrderType EVar8;
  
  Q_Lock(Q);
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    Q_00 = (QMatrix *)0x0;
    goto LAB_0010d557;
  }
  Q_00 = (QMatrix *)malloc(0xb0);
  pcVar2 = Q_GetName(Q);
  sVar3 = strlen(pcVar2);
  pcVar2 = (char *)malloc(sVar3 + 10);
  Object1Name = Q_GetName(Q);
  if (pcVar2 == (char *)0x0 || Q_00 == (QMatrix *)0x0) {
    LASError(LASMemAllocErr,"Transp_Q",Object1Name,(char *)0x0,(char *)0x0);
    if (Q_00 != (QMatrix *)0x0) {
      free(Q_00);
    }
  }
  else {
    sprintf(pcVar2,"(%s)^T",Object1Name);
    Q_Constr(Q_00,pcVar2,Q->Dim,Q->Symmetry,Q->ElOrder,Tempor,False);
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      if ((Q->Instance == Tempor) && (Q->OwnData != False)) {
        Q->OwnData = False;
        Q_00->OwnData = True;
      }
      if (Q->Symmetry == False) {
        lVar7 = 0x88;
        lVar6 = 0x90;
        lVar5 = 0x78;
        lVar4 = 0x80;
        if (Q->ElOrder == Rowws) {
          EVar8 = Clmws;
        }
        else {
          if (Q->ElOrder != Clmws) goto LAB_0010d4ae;
          EVar8 = Rowws;
        }
        Q_00->ElOrder = EVar8;
      }
      else {
        lVar7 = 0x78;
        lVar6 = 0x80;
        lVar5 = 0x88;
        lVar4 = 0x90;
      }
LAB_0010d4ae:
      Q_00->MultiplD = Q->MultiplD;
      Q_00->MultiplU = Q->MultiplL;
      Q_00->MultiplL = Q->MultiplU;
      Q_00->Len = Q->Len;
      Q_00->El = Q->El;
      Q_00->ElSorted = Q->ElSorted;
      Q_00->DiagElAlloc = Q->DiagElAlloc;
      Q_00->DiagEl = Q->DiagEl;
      Q_00->ZeroInDiag = Q->ZeroInDiag;
      Q_00->InvDiagEl = Q->InvDiagEl;
      Q_00->UnitRightKer = *(Boolean *)((long)&Q->Name + lVar7);
      Q_00->RightKerCmp = *(Real **)((long)&Q->Name + lVar6);
      Q_00->UnitLeftKer = *(Boolean *)((long)&Q->Name + lVar5);
      Q_00->LeftKerCmp = *(Real **)((long)&Q->Name + lVar4);
      Q_00->ILUExists = Q->ILUExists;
      Q_00->ILU = Q->ILU;
    }
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
LAB_0010d557:
  Q_Unlock(Q);
  return Q_00;
}

Assistant:

QMatrix *Transp_Q(QMatrix *Q)
/* QRes = Q^T, returns transposed matrix Q */
{
    QMatrix *QRes;

    char *QResName;

    Q_Lock(Q);
    
    if (LASResult() == LASOK) {
        QRes = (QMatrix *)malloc(sizeof(QMatrix));
        QResName = (char *)malloc((strlen(Q_GetName(Q)) + 10) * sizeof(char));
        if (QRes != NULL && QResName != NULL) {
            sprintf(QResName, "(%s)^T", Q_GetName(Q));
            Q_Constr(QRes, QResName, Q->Dim, Q->Symmetry, Q->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (Q->Instance == Tempor && Q->OwnData) {
                    Q->OwnData = False;
                    QRes->OwnData = True;
                }
                if (!Q->Symmetry) {
                    if (Q->ElOrder == Rowws)
                        QRes->ElOrder = Clmws;
                    if (Q->ElOrder == Clmws)
                        QRes->ElOrder = Rowws;
                }
                QRes->MultiplD = Q->MultiplD;
                QRes->MultiplU = Q->MultiplL;
                QRes->MultiplL = Q->MultiplU;
                QRes->Len = Q->Len;
                QRes->El = Q->El;
                QRes->ElSorted = Q->ElSorted;
                QRes->DiagElAlloc = Q->DiagElAlloc;
                QRes->DiagEl = Q->DiagEl;
                QRes->ZeroInDiag = Q->ZeroInDiag;
                QRes->InvDiagEl = Q->InvDiagEl;
                if (!Q->Symmetry) {
                    QRes->UnitRightKer = Q->UnitLeftKer;
                    QRes->RightKerCmp = Q->LeftKerCmp;
                    QRes->UnitLeftKer = Q->UnitRightKer;
                    QRes->LeftKerCmp = Q->RightKerCmp;
                } else {
                    QRes->UnitRightKer = Q->UnitRightKer;
                    QRes->RightKerCmp = Q->RightKerCmp;
                    QRes->UnitLeftKer = Q->UnitLeftKer;
                    QRes->LeftKerCmp = Q->LeftKerCmp;
                }
                QRes->ILUExists = Q->ILUExists;
                QRes->ILU = Q->ILU;
            }
        } else {
            LASError(LASMemAllocErr, "Transp_Q", Q_GetName(Q), NULL, NULL);
            if (QRes != NULL)
                free(QRes);
        }
            
        if (QResName != NULL)
            free(QResName);
    } else {
        QRes = NULL;
    }

    Q_Unlock(Q);

    return(QRes);
}